

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawSplineBasis(Vector2 *points,int pointCount,float thick,Color color)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector2 center;
  long lVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float radius;
  Vector2 vertices [50];
  Vector2 local_268;
  float afStack_1d4 [3];
  Vector2 local_1c8;
  float local_1c0;
  float local_1bc;
  float afStack_1b8 [98];
  
  if (3 < pointCount) {
    memset(&local_1c8,0,400);
    radius = thick * 0.5;
    fVar25 = 0.0;
    fVar24 = 0.0;
    fVar13 = 0.0;
    fVar16 = 0.0;
    uVar11 = 0;
    fVar19 = local_1c8.y;
    fVar21 = local_1c0;
    fVar17 = local_1bc;
    do {
      fVar2 = points[uVar11].x;
      fVar3 = points[uVar11].y;
      fVar4 = points[uVar11 + 1].x;
      fVar5 = points[uVar11 + 1].y;
      fVar6 = points[uVar11 + 2].x;
      fVar7 = points[uVar11 + 2].y;
      fVar8 = points[uVar11 + 3].x;
      fVar15 = (fVar4 * 4.0 + fVar2 + fVar6) / 6.0;
      fVar9 = points[uVar11 + 3].y;
      fVar23 = (fVar5 * 4.0 + fVar3 + fVar7) / 6.0;
      if (uVar11 == 0) {
        center.y = fVar23;
        center.x = fVar15;
        DrawCircleSector(center,radius,0.0,360.0,0x24,color);
      }
      else {
        local_1c0 = fVar15 - fVar13 * fVar25;
        local_1c8.x = fVar13 * fVar25 + fVar15;
        local_1c8.y = fVar23 - fVar24 * fVar25;
        local_1bc = fVar24 * fVar25 + fVar23;
        fVar19 = local_1c8.y;
        fVar21 = local_1c0;
        fVar17 = local_1bc;
        fVar16 = local_1c8.x;
      }
      uVar1 = uVar11 + 1;
      lVar10 = 0x1c;
      iVar12 = 1;
      fVar20 = fVar15;
      fVar22 = fVar23;
      do {
        fVar13 = (float)iVar12 / 24.0;
        local_268.x = ((fVar13 * ((fVar6 * -3.0 + (fVar4 * 3.0 - fVar2) + fVar8) / 6.0) +
                       (fVar2 * 3.0 + fVar4 * -6.0 + fVar6 * 3.0) / 6.0) * fVar13 +
                      (fVar2 * -3.0 + fVar6 * 3.0) / 6.0) * fVar13 + fVar15;
        local_268.y = ((fVar13 * ((fVar7 * -3.0 + (fVar5 * 3.0 - fVar3) + fVar9) / 6.0) +
                       (fVar3 * 3.0 + fVar5 * -6.0 + fVar7 * 3.0) / 6.0) * fVar13 +
                      (fVar3 * -3.0 + fVar7 * 3.0) / 6.0) * fVar13 + fVar23;
        fVar13 = local_268.y - fVar22;
        fVar24 = local_268.x - fVar20;
        fVar25 = fVar24 * fVar24 + fVar13 * fVar13;
        if (fVar25 < 0.0) {
          afStack_1d4[0] = fVar22;
          afStack_1d4[1] = fVar22;
          afStack_1d4[2] = fVar22;
          fVar25 = sqrtf(fVar25);
        }
        else {
          fVar25 = SQRT(fVar25);
        }
        fVar25 = radius / fVar25;
        fVar14 = fVar13 * fVar25;
        fVar18 = fVar24 * fVar25;
        if (lVar10 == 0x1c && uVar11 == 0) {
          fVar16 = fVar14 + fVar20;
          fVar21 = fVar20 - fVar14;
          fVar17 = fVar18 + fVar22;
          fVar19 = fVar22 - fVar18;
        }
        *(float *)((long)afStack_1d4 + lVar10 + 8) = local_268.x - fVar14;
        *(float *)((long)&local_1c8.x + lVar10) = fVar18 + local_268.y;
        *(float *)((long)afStack_1d4 + lVar10) = fVar14 + local_268.x;
        *(float *)((long)afStack_1d4 + lVar10 + 4) = local_268.y - fVar18;
        lVar10 = lVar10 + 0x10;
        iVar12 = iVar12 + 1;
        fVar20 = local_268.x;
        fVar22 = local_268.y;
      } while (lVar10 != 0x19c);
      local_1c8.x = fVar16;
      local_1c8.y = fVar19;
      local_1c0 = fVar21;
      local_1bc = fVar17;
      DrawTriangleStrip(&local_1c8,0x32,color);
      uVar11 = uVar1;
    } while (uVar1 != pointCount - 3);
    DrawCircleSector(local_268,radius,0.0,360.0,0x24,color);
  }
  return;
}

Assistant:

void DrawSplineBasis(const Vector2 *points, int pointCount, float thick, Color color)
{
    if (pointCount < 4) return;

    float a[4] = { 0 };
    float b[4] = { 0 };
    float dy = 0.0f;
    float dx = 0.0f;
    float size = 0.0f;

    Vector2 currentPoint = { 0 };
    Vector2 nextPoint = { 0 };
    Vector2 vertices[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 0; i < (pointCount - 3); i++)
    {
        float t = 0.0f;
        Vector2 p1 = points[i], p2 = points[i + 1], p3 = points[i + 2], p4 = points[i + 3];

        a[0] = (-p1.x + 3.0f*p2.x - 3.0f*p3.x + p4.x)/6.0f;
        a[1] = (3.0f*p1.x - 6.0f*p2.x + 3.0f*p3.x)/6.0f;
        a[2] = (-3.0f*p1.x + 3.0f*p3.x)/6.0f;
        a[3] = (p1.x + 4.0f*p2.x + p3.x)/6.0f;

        b[0] = (-p1.y + 3.0f*p2.y - 3.0f*p3.y + p4.y)/6.0f;
        b[1] = (3.0f*p1.y - 6.0f*p2.y + 3.0f*p3.y)/6.0f;
        b[2] = (-3.0f*p1.y + 3.0f*p3.y)/6.0f;
        b[3] = (p1.y + 4.0f*p2.y + p3.y)/6.0f;

        currentPoint.x = a[3];
        currentPoint.y = b[3];

        if (i == 0) DrawCircleV(currentPoint, thick/2.0f, color);   // Draw init line circle-cap

        if (i > 0)
        {
            vertices[0].x = currentPoint.x + dy*size;
            vertices[0].y = currentPoint.y - dx*size;
            vertices[1].x = currentPoint.x - dy*size;
            vertices[1].y = currentPoint.y + dx*size;
        }

        for (int j = 1; j <= SPLINE_SEGMENT_DIVISIONS; j++)
        {
            t = ((float)j)/((float)SPLINE_SEGMENT_DIVISIONS);

            nextPoint.x = a[3] + t*(a[2] + t*(a[1] + t*a[0]));
            nextPoint.y = b[3] + t*(b[2] + t*(b[1] + t*b[0]));

            dy = nextPoint.y - currentPoint.y;
            dx = nextPoint.x - currentPoint.x;
            size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

            if ((i == 0) && (j == 1))
            {
                vertices[0].x = currentPoint.x + dy*size;
                vertices[0].y = currentPoint.y - dx*size;
                vertices[1].x = currentPoint.x - dy*size;
                vertices[1].y = currentPoint.y + dx*size;
            }

            vertices[2*j + 1].x = nextPoint.x - dy*size;
            vertices[2*j + 1].y = nextPoint.y + dx*size;
            vertices[2*j].x = nextPoint.x + dy*size;
            vertices[2*j].y = nextPoint.y - dx*size;

            currentPoint = nextPoint;
        }

        DrawTriangleStrip(vertices, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
    }

    // Cap circle drawing at the end of every segment
    DrawCircleV(currentPoint, thick/2.0f, color);
}